

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::JavaHprofConfig_ContinuousDumpConfig
          (JavaHprofConfig_ContinuousDumpConfig *this,JavaHprofConfig_ContinuousDumpConfig *param_1)

{
  uint32_t uVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__JavaHprofConfig_ContinuousDumpConfig_004076b8;
  uVar1 = param_1->dump_interval_ms_;
  this->dump_phase_ms_ = param_1->dump_phase_ms_;
  this->dump_interval_ms_ = uVar1;
  this->scan_pids_only_on_start_ = param_1->scan_pids_only_on_start_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

JavaHprofConfig_ContinuousDumpConfig::JavaHprofConfig_ContinuousDumpConfig(JavaHprofConfig_ContinuousDumpConfig&&) noexcept = default;